

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O1

bool __thiscall
double_conversion::FastFixedDtoa
          (double_conversion *this,double v,int fractional_count,Vector<char> buffer,int *length,
          int *decimal_point)

{
  bool bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int *in_RAX;
  uint64_t d64;
  char *pcVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  int *piVar8;
  int *piVar9;
  uint uVar10;
  long lVar11;
  undefined4 in_register_00000034;
  ulong uVar12;
  long lVar13;
  uint32_t number;
  uint uVar14;
  int fractional_count_00;
  ulong uVar15;
  bool bVar16;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  
  buffer_00.start_ = (char *)CONCAT44(in_register_00000034,fractional_count);
  piVar8 = buffer._8_8_;
  bVar16 = ((ulong)v & 0x7ff0000000000000) == 0;
  uVar15 = ((ulong)v & 0xfffffffffffff) + 0x10000000000000;
  if (bVar16) {
    uVar15 = (ulong)v & 0xfffffffffffff;
  }
  uVar14 = 0xfffffbce;
  if (!bVar16) {
    uVar14 = ((uint)((ulong)v >> 0x34) & 0x7ff) - 0x433;
  }
  fractional_count_00 = (int)this;
  bVar16 = fractional_count_00 < 0x15 && (int)uVar14 < 0x15;
  if (fractional_count_00 >= 0x15 || (int)uVar14 >= 0x15) {
    return bVar16;
  }
  *piVar8 = 0;
  bVar6 = (byte)uVar14;
  if (0xb < (int)uVar14) {
    if ((int)uVar14 < 0x12) {
      uVar12 = 0xb1a2bc2ec5 << (0x11 - bVar6 & 0x3f);
      number = (uint32_t)(uVar15 / uVar12);
      piVar9 = (int *)(ulong)uVar14;
      uVar15 = uVar15 % uVar12 << (bVar6 & 0x3f);
    }
    else {
      uVar15 = uVar15 << (bVar6 - 0x11 & 0x3f);
      piVar9 = (int *)0x70ef54646d496893;
      number = (uint32_t)(uVar15 / 0xb1a2bc2ec5);
      uVar15 = (uVar15 % 0xb1a2bc2ec5) * 0x20000;
    }
    buffer_01._8_8_ = piVar8;
    buffer_01.start_ = buffer_00.start_;
    FillDigits32(number,buffer_01,piVar9);
    pcVar4 = buffer_00.start_ + 2;
    uVar14 = 4;
    uVar12 = uVar15 / 100000000000000;
    do {
      pcVar4[*piVar8] = (char)uVar12 + (char)(uVar12 / 10) * -10 | 0x30;
      uVar14 = uVar14 - 1;
      pcVar4 = pcVar4 + -1;
      uVar12 = uVar12 / 10;
    } while (1 < uVar14);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar15 / 10000000;
    *piVar8 = *piVar8 + 3;
    uVar14 = (int)(uVar15 / 10000000) + SUB164(auVar2 * ZEXT816(0x1ad7f29abcb),8) * -10000000;
    pcVar4 = buffer_00.start_ + 6;
    uVar10 = 8;
    do {
      pcVar4[*piVar8] = (char)uVar14 + (char)(uVar14 / 10) * -10 | 0x30;
      uVar10 = uVar10 - 1;
      pcVar4 = pcVar4 + -1;
      uVar14 = uVar14 / 10;
    } while (1 < uVar10);
    *piVar8 = *piVar8 + 7;
    pcVar4 = buffer_00.start_ + 6;
    uVar14 = 8;
    uVar15 = uVar15 % 10000000;
    do {
      pcVar4[*piVar8] = (char)uVar15 + (char)(uVar15 / 10) * -10 | 0x30;
      uVar14 = uVar14 - 1;
      pcVar4 = pcVar4 + -1;
      uVar15 = uVar15 / 10;
    } while (1 < uVar14);
    iVar3 = *piVar8;
    *piVar8 = iVar3 + 7;
    *length = iVar3 + 7;
    goto LAB_003eac45;
  }
  if ((int)uVar14 < 0) {
    if ((int)uVar14 < -0x34) {
      if ((int)uVar14 < -0x80) {
        *buffer_00.start_ = '\0';
        *piVar8 = 0;
        iVar3 = -fractional_count_00;
        goto LAB_003eaa58;
      }
      *length = 0;
    }
    else {
      in_RAX = (int *)CONCAT44(fractional_count_00,(int)in_RAX);
      bVar6 = -bVar6;
      piVar9 = (int *)(ulong)CONCAT31((int3)(uVar14 >> 8),bVar6);
      uVar12 = uVar15 >> (bVar6 & 0x3f);
      uVar15 = uVar15 - (uVar12 << (bVar6 & 0x3f));
      if (uVar12 >> 0x20 == 0) {
        buffer_03._8_8_ = piVar8;
        buffer_03.start_ = buffer_00.start_;
        FillDigits32((uint32_t)uVar12,buffer_03,piVar9);
      }
      else {
        buffer_02._8_8_ = piVar8;
        buffer_02.start_ = buffer_00.start_;
        FillDigits64(uVar12,buffer_02,piVar9);
      }
      *length = *piVar8;
      fractional_count_00 = (int)((ulong)in_RAX >> 0x20);
    }
    buffer_04._8_8_ = piVar8;
    buffer_04.start_ = buffer_00.start_;
    FillFractionals(uVar15,uVar14,fractional_count_00,buffer_04,length,in_RAX);
  }
  else {
    buffer_00._8_8_ = piVar8;
    FillDigits64(uVar15 << (bVar6 & 0x3f),buffer_00,(int *)(ulong)uVar14);
    iVar3 = *piVar8;
LAB_003eaa58:
    *length = iVar3;
  }
LAB_003eac45:
  uVar15 = (ulong)*piVar8;
  if (0 < (long)uVar15) {
    do {
      if (buffer_00.start_[uVar15 - 1] != '0') goto LAB_003eac6d;
      *piVar8 = (int)uVar15 + -1;
      bVar1 = 1 < (long)uVar15;
      uVar15 = uVar15 - 1;
    } while (bVar1);
    uVar15 = 0;
  }
LAB_003eac6d:
  if ((int)uVar15 < 1) {
    uVar12 = 0;
  }
  else {
    uVar5 = 0;
    do {
      uVar12 = uVar5;
      if (buffer_00.start_[uVar5] != '0') break;
      uVar5 = uVar5 + 1;
      uVar12 = uVar15 & 0xffffffff;
    } while ((uVar15 & 0xffffffff) != uVar5);
  }
  iVar3 = (int)uVar12;
  if (iVar3 != 0) {
    iVar7 = *piVar8;
    if (iVar3 < iVar7) {
      lVar11 = (long)iVar3;
      lVar13 = 0;
      do {
        buffer_00.start_[lVar13] = buffer_00.start_[lVar11];
        lVar11 = lVar11 + 1;
        iVar7 = *piVar8;
        lVar13 = lVar13 + 1;
      } while (lVar11 < iVar7);
    }
    *piVar8 = iVar7 - iVar3;
    *length = *length - iVar3;
  }
  buffer_00.start_[*piVar8] = '\0';
  if (*piVar8 == 0) {
    *length = -fractional_count_00;
  }
  return bVar16;
}

Assistant:

bool FastFixedDtoa(double v,
                   int fractional_count,
                   Vector<char> buffer,
                   int* length,
                   int* decimal_point) {
  const uint32_t kMaxUInt32 = 0xFFFFFFFF;
  uint64_t significand = Double(v).Significand();
  int exponent = Double(v).Exponent();
  // v = significand * 2^exponent (with significand a 53bit integer).
  // If the exponent is larger than 20 (i.e. we may have a 73bit number) then we
  // don't know how to compute the representation. 2^73 ~= 9.5*10^21.
  // If necessary this limit could probably be increased, but we don't need
  // more.
  if (exponent > 20) return false;
  if (fractional_count > 20) return false;
  *length = 0;
  // At most kDoubleSignificandSize bits of the significand are non-zero.
  // Given a 64 bit integer we have 11 0s followed by 53 potentially non-zero
  // bits:  0..11*..0xxx..53*..xx
  if (exponent + kDoubleSignificandSize > 64) {
    // The exponent must be > 11.
    //
    // We know that v = significand * 2^exponent.
    // And the exponent > 11.
    // We simplify the task by dividing v by 10^17.
    // The quotient delivers the first digits, and the remainder fits into a 64
    // bit number.
    // Dividing by 10^17 is equivalent to dividing by 5^17*2^17.
    const uint64_t kFive17 = DOUBLE_CONVERSION_UINT64_2PART_C(0xB1, A2BC2EC5);  // 5^17
    uint64_t divisor = kFive17;
    int divisor_power = 17;
    uint64_t dividend = significand;
    uint32_t quotient;
    uint64_t remainder;
    // Let v = f * 2^e with f == significand and e == exponent.
    // Then need q (quotient) and r (remainder) as follows:
    //   v            = q * 10^17       + r
    //   f * 2^e      = q * 10^17       + r
    //   f * 2^e      = q * 5^17 * 2^17 + r
    // If e > 17 then
    //   f * 2^(e-17) = q * 5^17        + r/2^17
    // else
    //   f  = q * 5^17 * 2^(17-e) + r/2^e
    if (exponent > divisor_power) {
      // We only allow exponents of up to 20 and therefore (17 - e) <= 3
      dividend <<= exponent - divisor_power;
      quotient = static_cast<uint32_t>(dividend / divisor);
      remainder = (dividend % divisor) << divisor_power;
    } else {
      divisor <<= divisor_power - exponent;
      quotient = static_cast<uint32_t>(dividend / divisor);
      remainder = (dividend % divisor) << exponent;
    }
    FillDigits32(quotient, buffer, length);
    FillDigits64FixedLength(remainder, buffer, length);
    *decimal_point = *length;
  } else if (exponent >= 0) {
    // 0 <= exponent <= 11
    significand <<= exponent;
    FillDigits64(significand, buffer, length);
    *decimal_point = *length;
  } else if (exponent > -kDoubleSignificandSize) {
    // We have to cut the number.
    uint64_t integrals = significand >> -exponent;
    uint64_t fractionals = significand - (integrals << -exponent);
    if (integrals > kMaxUInt32) {
      FillDigits64(integrals, buffer, length);
    } else {
      FillDigits32(static_cast<uint32_t>(integrals), buffer, length);
    }
    *decimal_point = *length;
    FillFractionals(fractionals, exponent, fractional_count,
                    buffer, length, decimal_point);
  } else if (exponent < -128) {
    // This configuration (with at most 20 digits) means that all digits must be
    // 0.
    DOUBLE_CONVERSION_ASSERT(fractional_count <= 20);
    buffer[0] = '\0';
    *length = 0;
    *decimal_point = -fractional_count;
  } else {
    *decimal_point = 0;
    FillFractionals(significand, exponent, fractional_count,
                    buffer, length, decimal_point);
  }
  TrimZeros(buffer, length, decimal_point);
  buffer[*length] = '\0';
  if ((*length) == 0) {
    // The string is empty and the decimal_point thus has no importance. Mimic
    // Gay's dtoa and set it to -fractional_count.
    *decimal_point = -fractional_count;
  }
  return true;
}